

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

int testEpochsOutOfAllowedRange(void)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this;
  NeuralNetwork *pNVar1;
  ostream *poVar2;
  undefined1 local_e0 [8];
  Result res;
  set<long,_std::less<long>,_std::allocator<long>_> local_88;
  NeuralNetwork *local_48;
  NeuralNetwork *nn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&nn);
  local_48 = buildBasicUpdatableNeuralNetworkModel((Model *)&nn);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (local_48,kSgdOptimizer,0.699999988079071,0.0,1.0);
  pNVar1 = local_48;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_88._M_t._M_impl._0_8_ = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_88);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(pNVar1,kSgdOptimizer,0x14,10,100,&local_88)
  ;
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_88);
  pNVar1 = local_48;
  res.m_message.field_2._8_8_ = 0;
  this = (set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(this);
  addEpochs<CoreML::Specification::NeuralNetwork>(pNVar1,100,1,0x32,this);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8)
            );
  CoreML::Model::validate((Result *)local_e0,(Model *)&nn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_e0);
  if (m._oneof_case_[0]._0_1_) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/ParameterTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18a);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_e0);
  CoreML::Specification::Model::~Model((Model *)&nn);
  return m._oneof_case_[0];
}

Assistant:

int testEpochsOutOfAllowedRange() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(nn, Specification::Optimizer::kSgdOptimizer, 20, 10, 100);
    addEpochs(nn, 100, 1, 50, std::set<int64_t>());
    
    // expect validation to fail due to conflict in updatable model parameter names.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}